

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RestReader.cpp
# Opt level: O1

void __thiscall OpenMD::RestReader::parseDumpLine(RestReader *this,string *line)

{
  double dVar1;
  char cVar2;
  pointer pVVar3;
  double dVar4;
  uint i;
  int iVar5;
  StuntDouble *propName;
  long lVar6;
  ObjectRestraint *this_00;
  long lVar7;
  ulong uVar8;
  string *psVar9;
  RotMat3x3d *pRVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  byte bVar11;
  double tmp;
  undefined1 auVar12 [16];
  Quat4d q;
  shared_ptr<OpenMD::GenericData> data;
  string type;
  StringTokenizer tokenizer;
  RealType local_1b8;
  RealType local_1b0;
  RealType local_1a8;
  Quaternion<double> local_188;
  undefined1 local_160 [16];
  string local_150 [2];
  string local_108;
  Vector3d local_e8;
  StringTokenizer local_d0;
  RotMat3x3d local_78;
  
  bVar11 = 0;
  local_150[0]._M_dataplus._M_p = (pointer)&local_150[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150," ;\t\n\r","");
  StringTokenizer::StringTokenizer(&local_d0,line,local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150[0]._M_dataplus._M_p != &local_150[0].field_2) {
    operator_delete(local_150[0]._M_dataplus._M_p,local_150[0].field_2._M_allocated_capacity + 1);
  }
  iVar5 = StringTokenizer::countTokens(&local_d0);
  if (iVar5 < 2) {
    snprintf(painCave.errMsg,2000,"RestReader Error: Not enough Tokens.\n%s\n",
             (line->_M_dataplus)._M_p);
    painCave.isFatal = 1;
    simError();
  }
  iVar5 = StringTokenizer::nextTokenAsInt(&local_d0);
  propName = SimInfo::getIOIndexToIntegrableObject(this->info_,iVar5);
  if (propName != (StuntDouble *)0x0) {
    StringTokenizer::nextToken_abi_cxx11_(&local_108,&local_d0);
    local_188.super_Vector<double,_4U>.data_[2] = 0.0;
    local_188.super_Vector<double,_4U>.data_[3] = 0.0;
    local_188.super_Vector<double,_4U>.data_[0] = 0.0;
    local_188.super_Vector<double,_4U>.data_[1] = 0.0;
    if (0 < (int)(uint)local_108._M_string_length) {
      local_1a8 = 0.0;
      local_1b0 = 0.0;
      local_1b8 = 0.0;
      uVar8 = 0;
      do {
        cVar2 = local_108._M_dataplus._M_p[uVar8];
        switch(cVar2) {
        case 'p':
          local_1a8 = StringTokenizer::nextTokenAsDouble(&local_d0);
          local_1b0 = StringTokenizer::nextTokenAsDouble(&local_d0);
          local_1b8 = StringTokenizer::nextTokenAsDouble(&local_d0);
          break;
        case 'q':
          if (propName->objType_ - otDAtom < 2) {
            local_188.super_Vector<double,_4U>.data_[0] =
                 StringTokenizer::nextTokenAsDouble(&local_d0);
            local_188.super_Vector<double,_4U>.data_[1] =
                 StringTokenizer::nextTokenAsDouble(&local_d0);
            local_188.super_Vector<double,_4U>.data_[2] =
                 StringTokenizer::nextTokenAsDouble(&local_d0);
            local_188.super_Vector<double,_4U>.data_[3] =
                 StringTokenizer::nextTokenAsDouble(&local_d0);
            dVar4 = 0.0;
            lVar7 = 0;
            do {
              dVar1 = local_188.super_Vector<double,_4U>.data_[lVar7];
              dVar4 = dVar4 + dVar1 * dVar1;
              lVar7 = lVar7 + 1;
            } while (lVar7 != 4);
            if (dVar4 < 0.0) {
              dVar4 = sqrt(dVar4);
            }
            else {
              dVar4 = SQRT(dVar4);
            }
            if (dVar4 < 1e-06) {
              memcpy(&painCave,
                     "RestReader Error: initial quaternion error (q0^2 + q1^2 + q2^2 + q3^2) ~ 0\n",
                     0x4c);
              painCave.isFatal = 1;
              simError();
            }
            dVar4 = 0.0;
            lVar7 = 0;
            do {
              dVar1 = local_188.super_Vector<double,_4U>.data_[lVar7];
              dVar4 = dVar4 + dVar1 * dVar1;
              lVar7 = lVar7 + 1;
            } while (lVar7 != 4);
            if (dVar4 < 0.0) {
              dVar4 = sqrt(dVar4);
            }
            else {
              dVar4 = SQRT(dVar4);
            }
            lVar7 = 0;
            do {
              auVar12._8_4_ = SUB84(dVar4,0);
              auVar12._0_8_ = dVar4;
              auVar12._12_4_ = (int)((ulong)dVar4 >> 0x20);
              auVar12 = divpd(*(undefined1 (*) [16])
                               (local_188.super_Vector<double,_4U>.data_ + lVar7),auVar12);
              *(undefined1 (*) [16])(local_188.super_Vector<double,_4U>.data_ + lVar7) = auVar12;
              lVar7 = lVar7 + 2;
            } while (lVar7 != 4);
          }
          break;
        case 'r':
        case 's':
        case 'u':
switchD_001767a7_caseD_72:
          snprintf(painCave.errMsg,2000,"RestReader Error: %s is an unrecognized type\n");
          painCave.isFatal = 1;
          simError();
          break;
        case 't':
          StringTokenizer::nextTokenAsDouble(&local_d0);
          StringTokenizer::nextTokenAsDouble(&local_d0);
          StringTokenizer::nextTokenAsDouble(&local_d0);
          break;
        case 'v':
          StringTokenizer::nextTokenAsDouble(&local_d0);
          StringTokenizer::nextTokenAsDouble(&local_d0);
          StringTokenizer::nextTokenAsDouble(&local_d0);
          break;
        default:
          if (cVar2 == 'f') {
            StringTokenizer::nextTokenAsDouble(&local_d0);
            StringTokenizer::nextTokenAsDouble(&local_d0);
            StringTokenizer::nextTokenAsDouble(&local_d0);
          }
          else {
            if (cVar2 != 'j') goto switchD_001767a7_caseD_72;
            if (propName->objType_ - otDAtom < 2) {
              StringTokenizer::nextTokenAsDouble(&local_d0);
              StringTokenizer::nextTokenAsDouble(&local_d0);
              StringTokenizer::nextTokenAsDouble(&local_d0);
            }
          }
        }
        pVVar3 = (this->all_pos_).
                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pVVar3[iVar5].super_Vector<double,_3U>.data_[0] = local_1a8;
        pVVar3[iVar5].super_Vector<double,_3U>.data_[1] = local_1b0;
        pVVar3[iVar5].super_Vector<double,_3U>.data_[2] = local_1b8;
        local_150[0]._M_dataplus._M_p = (pointer)&local_150[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"Restraint","");
        StuntDouble::getPropertyByName((StuntDouble *)local_160,(string *)propName);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150[0]._M_dataplus._M_p != &local_150[0].field_2) {
          operator_delete(local_150[0]._M_dataplus._M_p,
                          local_150[0].field_2._M_allocated_capacity + 1);
        }
        if ((_func_int **)local_160._0_8_ != (_func_int **)0x0) {
          lVar6 = __dynamic_cast(local_160._0_8_,&GenericData::typeinfo,
                                 &SimpleTypeData<OpenMD::Restraint*>::typeinfo,0);
          lVar7 = 0;
          this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if ((lVar6 != 0) &&
             (lVar7 = lVar6,
             this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_160._8_8_,
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_160._8_8_ !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(local_160._8_8_ + 8) = *(_Atomic_word *)(local_160._8_8_ + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(local_160._8_8_ + 8) = *(_Atomic_word *)(local_160._8_8_ + 8) + 1;
            }
          }
          if (lVar7 != 0) {
            if (*(long *)(lVar7 + 0x28) == 0) {
              this_00 = (ObjectRestraint *)0x0;
            }
            else {
              this_00 = (ObjectRestraint *)
                        __dynamic_cast(*(long *)(lVar7 + 0x28),&Restraint::typeinfo,
                                       &ObjectRestraint::typeinfo,0);
            }
            if (this_00 == (ObjectRestraint *)0x0) {
              builtin_strncpy(painCave.errMsg + 0x10,"traintData to ObjectRestraint\n",0x1f);
              builtin_strncpy(painCave.errMsg,"Can not cast Res",0x10);
              painCave.isFatal = 1;
              painCave.severity = 1;
              simError();
            }
            else if (propName->objType_ - otDAtom < 2) {
              local_e8.super_Vector<double,_3U>.data_[0] = local_1a8;
              local_e8.super_Vector<double,_3U>.data_[1] = local_1b0;
              local_e8.super_Vector<double,_3U>.data_[2] = local_1b8;
              Quaternion<double>::toRotationMatrix3((SquareMatrix<double,_3> *)local_150,&local_188)
              ;
              psVar9 = local_150;
              pRVar10 = &local_78;
              for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
                (pRVar10->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
                [0] = (double)(psVar9->_M_dataplus)._M_p;
                psVar9 = (string *)((long)psVar9 + (ulong)bVar11 * -0x10 + 8);
                pRVar10 = (RotMat3x3d *)((long)pRVar10 + ((ulong)bVar11 * -2 + 1) * 8);
              }
              ObjectRestraint::setReferenceStructure(this_00,&local_e8,&local_78);
            }
            else {
              (this_00->refPos_).super_Vector<double,_3U>.data_[0] = local_1a8;
              (this_00->refPos_).super_Vector<double,_3U>.data_[1] = local_1b0;
              (this_00->refPos_).super_Vector<double,_3U>.data_[2] = local_1b8;
            }
          }
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
          }
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_160._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_160._8_8_);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != ((uint)local_108._M_string_length & 0x7fffffff));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.delim_._M_dataplus._M_p != &local_d0.delim_.field_2) {
    operator_delete(local_d0.delim_._M_dataplus._M_p,
                    local_d0.delim_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.tokenString_._M_dataplus._M_p != &local_d0.tokenString_.field_2) {
    operator_delete(local_d0.tokenString_._M_dataplus._M_p,
                    local_d0.tokenString_.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void RestReader::parseDumpLine(const std::string& line) {
    StringTokenizer tokenizer(line);
    int nTokens;

    nTokens = tokenizer.countTokens();

    if (nTokens < 2) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RestReader Error: Not enough Tokens.\n%s\n", line.c_str());
      painCave.isFatal = 1;
      simError();
    }

    int index = tokenizer.nextTokenAsInt();

    StuntDouble* sd = info_->getIOIndexToIntegrableObject(index);

    if (sd == NULL) { return; }

    std::string type = tokenizer.nextToken();
    int size         = type.size();

    Vector3d pos;
    Quat4d q;

    for (int i = 0; i < size; ++i) {
      switch (type[i]) {
      case 'p': {
        pos[0] = tokenizer.nextTokenAsDouble();
        pos[1] = tokenizer.nextTokenAsDouble();
        pos[2] = tokenizer.nextTokenAsDouble();
        break;
      }
      case 'v': {
        Vector3d vel;
        vel[0] = tokenizer.nextTokenAsDouble();
        vel[1] = tokenizer.nextTokenAsDouble();
        vel[2] = tokenizer.nextTokenAsDouble();
        break;
      }

      case 'q': {
        if (sd->isDirectional()) {
          q[0] = tokenizer.nextTokenAsDouble();
          q[1] = tokenizer.nextTokenAsDouble();
          q[2] = tokenizer.nextTokenAsDouble();
          q[3] = tokenizer.nextTokenAsDouble();

          RealType qlen = q.length();
          if (qlen < OpenMD::epsilon) {  // check quaternion is not equal to 0

            snprintf(
                painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                "RestReader Error: initial quaternion error (q0^2 + q1^2 + "
                "q2^2 + "
                "q3^2) ~ 0\n");
            painCave.isFatal = 1;
            simError();
          }

          q.normalize();
        }
        break;
      }
      case 'j': {
        Vector3d ji;
        if (sd->isDirectional()) {
          ji[0] = tokenizer.nextTokenAsDouble();
          ji[1] = tokenizer.nextTokenAsDouble();
          ji[2] = tokenizer.nextTokenAsDouble();
        }
        break;
      }
      case 'f': {
        Vector3d force;
        force[0] = tokenizer.nextTokenAsDouble();
        force[1] = tokenizer.nextTokenAsDouble();
        force[2] = tokenizer.nextTokenAsDouble();
        break;
      }
      case 't': {
        Vector3d torque;
        torque[0] = tokenizer.nextTokenAsDouble();
        torque[1] = tokenizer.nextTokenAsDouble();
        torque[2] = tokenizer.nextTokenAsDouble();
        break;
      }
      default: {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "RestReader Error: %s is an unrecognized type\n",
                 type.c_str());
        painCave.isFatal = 1;
        simError();
        break;
      }
      }
      // keep the position in case we need it for a molecular restraint:

      all_pos_[index] = pos;

      // is this io restrained?
      std::shared_ptr<GenericData> data = sd->getPropertyByName("Restraint");

      if (data != nullptr) {
        // make sure we can reinterpret the generic data as restraint data:
        std::shared_ptr<RestraintData> restData =
            std::dynamic_pointer_cast<RestraintData>(data);
        if (restData != nullptr) {
          // make sure we can reinterpet the restraint data as a pointer to
          // an ObjectRestraint:
          ObjectRestraint* oRest =
              dynamic_cast<ObjectRestraint*>(restData->getData());
          if (oRest == NULL) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "Can not cast RestraintData to ObjectRestraint\n");
            painCave.severity = OPENMD_ERROR;
            painCave.isFatal  = 1;
            simError();
          } else {
            if (sd->isDirectional()) {
              oRest->setReferenceStructure(pos, q.toRotationMatrix3());
            } else {
              oRest->setReferenceStructure(pos);
            }
          }
        }
      }
    }
  }